

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_package.cpp
# Opt level: O1

bool __thiscall
ParsePackage::PackageFuncList
          (ParsePackage *this,char *buf,int *len,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *func_map)

{
  bool bVar1;
  bool bVar2;
  size_t sVar3;
  _Base_ptr p_Var4;
  char *pcVar5;
  char *pcVar6;
  ParsePackage *this_00;
  int num;
  char *local_70;
  char *local_68;
  ParsePackage *local_60;
  _Base_ptr local_58;
  int local_4c;
  char *local_48;
  int *local_40;
  _Base_ptr local_38;
  
  if (buf != (char *)0x0) {
    pcVar5 = buf + *len;
    local_4c = (int)(func_map->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    local_70 = (char *)CONCAT44(local_70._4_4_,4);
    local_40 = len;
    bVar1 = _SafeSprintf<MessageType>(this,false,buf,pcVar5,"%d|",(MessageType *)&local_70);
    if (!bVar1) {
      return false;
    }
    pcVar6 = buf + 2;
    bVar1 = _SafeSprintf<int&>(this,false,pcVar6,pcVar5,"%d|",&local_4c);
    if (!bVar1) {
      return false;
    }
    sVar3 = strlen(pcVar6);
    pcVar6 = pcVar6 + sVar3;
    p_Var4 = (func_map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_38 = &(func_map->_M_t)._M_impl.super__Rb_tree_header._M_header;
    bVar1 = p_Var4 == local_38;
    local_68 = pcVar5;
    local_60 = this;
    local_48 = buf;
    if (!bVar1) {
      local_70 = *(char **)(p_Var4 + 1);
      local_58 = p_Var4;
      bVar2 = _SafeSprintf<char_const*>(this,false,pcVar6,pcVar5,"%s|",&local_70);
      if (bVar2) {
        this_00 = local_60;
        pcVar5 = local_68;
        do {
          sVar3 = strlen(pcVar6);
          pcVar6 = pcVar6 + sVar3;
          local_70 = *(char **)(local_58 + 2);
          bVar2 = _SafeSprintf<char_const*>(this_00,false,pcVar6,pcVar5,"%s|",&local_70);
          if (!bVar2) break;
          sVar3 = strlen(pcVar6);
          pcVar6 = pcVar6 + sVar3;
          p_Var4 = (_Base_ptr)std::_Rb_tree_increment(local_58);
          this_00 = local_60;
          pcVar5 = local_68;
          bVar1 = p_Var4 == local_38;
          if (bVar1) break;
          local_70 = *(char **)(p_Var4 + 1);
          local_58 = p_Var4;
          bVar2 = _SafeSprintf<char_const*>(local_60,false,pcVar6,local_68,"%s|",&local_70);
        } while (bVar2);
      }
    }
    if (bVar1) {
      bVar1 = _SafeSprintf<char_const(&)[5]>
                        (local_60,false,pcVar6,local_68,"%s",(char (*) [5])"\r\n\r\n");
      pcVar5 = local_48;
      if (!bVar1) {
        return false;
      }
      sVar3 = strlen(pcVar6);
      *local_40 = ((int)sVar3 + (int)pcVar6) - (int)pcVar5;
      return true;
    }
  }
  return false;
}

Assistant:

bool ParsePackage::PackageFuncList(char* buf, int& len, std::map<std::string, std::string>& func_map) {
    if (!buf) {
        return false;
    }

    char* end = buf + len;
    char* cur = buf;
    int num = (int)func_map.size();
    //type
    if (!_SafeSprintf(false, cur, end, "%d|", FUNCTION_INFO))
        return false;
    cur += 2;
    //function num
    if (!_SafeSprintf(false, cur, end, "%d|", num))
        return false;
    cur += strlen(cur);
    
    for (auto iter = func_map.begin(); iter != func_map.end(); ++iter) {
        if (!_SafeSprintf(false, cur, end, "%s|", iter->first.c_str()))
            return false;
        cur += strlen(cur);

        if (!_SafeSprintf(false, cur, end, "%s|", iter->second.c_str()))
            return false;
        cur += strlen(cur);
    }
    if (!_SafeSprintf(false, cur, end, "%s", "\r\n\r\n"))
        return false;
    cur += strlen(cur);
    len = cur - buf;
    return true;
}